

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_user.cpp
# Opt level: O0

void P_CrouchMove(player_t *player,int direction)

{
  APlayerPawn *pAVar1;
  bool bVar2;
  AActor *pAVar3;
  double dVar4;
  DVector3 local_60;
  TVector2<double> local_48;
  double local_38;
  double oldheight;
  double crouchspeed;
  double savedheight;
  double defaultheight;
  player_t *ppStack_10;
  int direction_local;
  player_t *player_local;
  
  defaultheight._4_4_ = direction;
  ppStack_10 = player;
  pAVar3 = AActor::GetDefault(&player->mo->super_AActor);
  savedheight = pAVar3->Height;
  crouchspeed = (ppStack_10->mo->super_AActor).Height;
  oldheight = (double)defaultheight._4_4_ * 0.08333333333333333;
  local_38 = ppStack_10->viewheight;
  ppStack_10->crouchdir = (SBYTE)defaultheight._4_4_;
  ppStack_10->crouchfactor = oldheight + ppStack_10->crouchfactor;
  (ppStack_10->mo->super_AActor).Height = savedheight * ppStack_10->crouchfactor;
  pAVar1 = ppStack_10->mo;
  AActor::Pos(&local_60,&ppStack_10->mo->super_AActor);
  TVector2<double>::TVector2(&local_48,&local_60);
  bVar2 = P_TryMove(&pAVar1->super_AActor,&local_48,0,(secplane_t *)0x0);
  if ((((bVar2 ^ 0xffU) & 1) == 0) ||
     ((ppStack_10->mo->super_AActor).Height = crouchspeed, defaultheight._4_4_ < 1)) {
    (ppStack_10->mo->super_AActor).Height = crouchspeed;
    dVar4 = clamp<double>(ppStack_10->crouchfactor,0.5,1.0);
    ppStack_10->crouchfactor = dVar4;
    ppStack_10->viewheight = ppStack_10->mo->ViewHeight * ppStack_10->crouchfactor;
    ppStack_10->crouchviewdelta = ppStack_10->viewheight - ppStack_10->mo->ViewHeight;
    pAVar1 = ppStack_10->mo;
    dVar4 = AActor::Z(&ppStack_10->mo->super_AActor);
    P_CheckFakeFloorTriggers(&pAVar1->super_AActor,dVar4 + local_38,true);
  }
  else {
    ppStack_10->crouchfactor = ppStack_10->crouchfactor - oldheight;
  }
  return;
}

Assistant:

void P_CrouchMove(player_t * player, int direction)
{
	double defaultheight = player->mo->GetDefault()->Height;
	double savedheight = player->mo->Height;
	double crouchspeed = direction * CROUCHSPEED;
	double oldheight = player->viewheight;

	player->crouchdir = (signed char) direction;
	player->crouchfactor += crouchspeed;

	// check whether the move is ok
	player->mo->Height  = defaultheight * player->crouchfactor;
	if (!P_TryMove(player->mo, player->mo->Pos(), false, NULL))
	{
		player->mo->Height = savedheight;
		if (direction > 0)
		{
			// doesn't fit
			player->crouchfactor -= crouchspeed;
			return;
		}
	}
	player->mo->Height = savedheight;

	player->crouchfactor = clamp(player->crouchfactor, 0.5, 1.);
	player->viewheight = player->mo->ViewHeight * player->crouchfactor;
	player->crouchviewdelta = player->viewheight - player->mo->ViewHeight;

	// Check for eyes going above/below fake floor due to crouching motion.
	P_CheckFakeFloorTriggers(player->mo, player->mo->Z() + oldheight, true);
}